

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsd.cpp
# Opt level: O3

image_char new_image_char_ini(uint xsize,uint ysize,uchar fill_value)

{
  int *piVar1;
  undefined1 auVar2 [16];
  image_char piVar3;
  image_char extraout_RAX;
  uchar *puVar4;
  image_int piVar5;
  int extraout_EDX;
  uint uVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  uint xsize_00;
  undefined4 in_register_0000003c;
  int iVar12;
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iVar16;
  uchar *__ptr;
  
  puVar4 = (uchar *)CONCAT44(in_register_0000003c,xsize);
  uVar7 = ysize;
  piVar3 = new_image_char(xsize,ysize);
  if ((piVar3 != (image_char)0x0) && (puVar4 = piVar3->data, puVar4 != (uchar *)0x0)) {
    if (ysize * xsize != 0) {
      memset(puVar4,(uint)fill_value,(ulong)(ysize * xsize));
    }
    return piVar3;
  }
  new_image_char_ini();
  __ptr = puVar4;
  if ((puVar4 != (uchar *)0x0) && (__ptr = *(uchar **)puVar4, __ptr != (uchar *)0x0)) {
    free(__ptr);
    free(puVar4);
    return extraout_RAX;
  }
  uVar10 = (uint)__ptr;
  free_image_int();
  uVar6 = uVar7;
  if ((uVar10 == 0) || (uVar7 == 0)) {
    xsize_00 = uVar10;
    new_image_int();
  }
  else {
    xsize_00 = 0x10;
    piVar3 = (image_char)malloc(0x10);
    if (piVar3 != (image_char)0x0) {
      xsize_00 = uVar7 * uVar10;
      uVar6 = 4;
      puVar4 = (uchar *)calloc((ulong)xsize_00,4);
      piVar3->data = puVar4;
      if (puVar4 != (uchar *)0x0) {
        piVar3->xsize = uVar10;
        piVar3->ysize = uVar7;
        return piVar3;
      }
      goto LAB_0010427d;
    }
  }
  new_image_int();
LAB_0010427d:
  new_image_int();
  piVar5 = new_image_int(xsize_00,uVar6);
  auVar2 = _DAT_00108030;
  uVar6 = uVar6 * xsize_00;
  if (uVar6 != 0) {
    piVar1 = piVar5->data;
    lVar8 = (ulong)uVar6 - 1;
    auVar11._8_4_ = (int)lVar8;
    auVar11._0_8_ = lVar8;
    auVar11._12_4_ = (int)((ulong)lVar8 >> 0x20);
    uVar9 = 0;
    auVar11 = auVar11 ^ _DAT_00108030;
    auVar13 = _DAT_00108010;
    auVar14 = _DAT_00108020;
    do {
      auVar15 = auVar14 ^ auVar2;
      iVar12 = auVar11._4_4_;
      if ((bool)(~(auVar15._4_4_ == iVar12 && auVar11._0_4_ < auVar15._0_4_ ||
                  iVar12 < auVar15._4_4_) & 1)) {
        piVar1[uVar9] = extraout_EDX;
      }
      if ((auVar15._12_4_ != auVar11._12_4_ || auVar15._8_4_ <= auVar11._8_4_) &&
          auVar15._12_4_ <= auVar11._12_4_) {
        piVar1[uVar9 + 1] = extraout_EDX;
      }
      auVar15 = auVar13 ^ auVar2;
      iVar16 = auVar15._4_4_;
      if (iVar16 <= iVar12 && (iVar16 != iVar12 || auVar15._0_4_ <= auVar11._0_4_)) {
        piVar1[uVar9 + 2] = extraout_EDX;
        piVar1[uVar9 + 3] = extraout_EDX;
      }
      uVar9 = uVar9 + 4;
      lVar8 = auVar14._8_8_;
      auVar14._0_8_ = auVar14._0_8_ + 4;
      auVar14._8_8_ = lVar8 + 4;
      lVar8 = auVar13._8_8_;
      auVar13._0_8_ = auVar13._0_8_ + 4;
      auVar13._8_8_ = lVar8 + 4;
    } while (((ulong)uVar6 + 3 & 0xfffffffffffffffc) != uVar9);
  }
  return (image_char)piVar5;
}

Assistant:

image_char new_image_char_ini( unsigned int xsize, unsigned int ysize,
                               unsigned char fill_value )
{
    image_char image = new_image_char(xsize, ysize); /* create image */
    unsigned int N = xsize * ysize;
    unsigned int i;

    /* check parameters */
    if ( image == NULL || image->data == NULL )
        error("new_image_char_ini: invalid image.");

    /* initialize */
    for (i = 0; i < N; i++) image->data[i] = fill_value;

    return image;
}